

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

JSON __thiscall
QPDFJob::json_schema
          (QPDFJob *this,int json_version,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  const_iterator cVar6;
  long *plVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  byte bVar10;
  char *pcVar11;
  string *key;
  JSON JVar12;
  string MODIFY_ANNOTATIONS;
  JSON objectinfo;
  JSON attachments;
  JSON encrypt;
  JSON j_params;
  undefined1 local_118 [32];
  string local_f8;
  undefined1 local_d8 [32];
  string *local_b8;
  undefined1 local_b0 [32];
  JSON local_90;
  JSON local_80;
  JSON local_70;
  JSON local_60;
  JSON local_50;
  JSON local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  
  JSON::makeDictionary();
  local_118._0_8_ = local_118 + 0x10;
  local_b8 = (string *)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"version","");
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"JSON format serial number; increased for non-compatible changes",
             "");
  JSON::makeString((JSON *)local_d8,&local_f8);
  JSON::addDictionaryMember(&local_40,(string *)this,(JSON *)local_118);
  if (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  local_118._0_8_ = local_118 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"parameters","");
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,
             "{\n  \"decodelevel\": \"decode level used to determine stream filterability\"\n}","");
  JSON::parse((JSON *)local_d8,&local_f8);
  JSON::addDictionaryMember(&local_70,(string *)this,(JSON *)local_118);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if (keys == (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
    bVar3 = true;
    if (json_version != 1) goto LAB_00180475;
    goto LAB_001802a2;
  }
  sVar2 = (keys->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  if (json_version == 1) {
    if (sVar2 == 0) {
      bVar3 = true;
LAB_001802a2:
      local_118._0_8_ = local_118 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"objects","");
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,
                 "{\n  \"<n n R|trailer>\": \"json representation of object\"\n}","");
      JSON::parse((JSON *)local_d8,&local_f8);
      JSON::addDictionaryMember(&local_50,(string *)this,(JSON *)local_118);
      if (local_50.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
      }
      bVar4 = true;
      if (!bVar3) goto LAB_0018035c;
    }
    else {
      local_118._0_8_ = local_118 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"objects","");
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&keys->_M_t,(key_type *)local_118);
      if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
      }
      if ((_Rb_tree_header *)cVar6._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header) {
        bVar3 = false;
        goto LAB_001802a2;
      }
LAB_0018035c:
      local_118._0_8_ = local_118 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"objectinfo","");
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&keys->_M_t,(key_type *)local_118);
      if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
      }
      if ((_Rb_tree_header *)cVar6._M_node == &(keys->_M_t)._M_impl.super__Rb_tree_header) {
        bVar10 = 1;
        goto LAB_00180538;
      }
      bVar4 = false;
    }
    local_118._0_8_ = local_118 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"objectinfo","");
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,
               "{\n  \"<object-id>\": {\n    \"stream\": {\n      \"filter\": \"if stream, its filters, otherwise null\",\n      \"is\": \"whether the object is a stream\",\n      \"length\": \"if stream, its length, otherwise null\"\n    }\n  }\n}"
               ,"");
    JSON::parse((JSON *)local_b0,&local_f8);
    JSON::addDictionaryMember((JSON *)local_d8,(string *)this,(JSON *)local_118);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    bVar10 = 1;
    bVar5 = true;
    if (!bVar4) goto LAB_00180538;
LAB_00180593:
    local_118._0_8_ = local_118 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"pages","");
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,
               "[\n  {\n    \"contents\": [\n      \"reference to each content stream\"\n    ],\n    \"images\": [\n      {\n        \"bitspercomponent\": \"bits per component\",\n        \"colorspace\": \"color space\",\n        \"decodeparms\": [\n          \"decode parameters for image data\"\n        ],\n        \"filter\": [\n          \"filters applied to image data\"\n        ],\n        \"filterable\": \"whether image data can be decoded using the decode level qpdf was invoked with\",\n        \"height\": \"image height\",\n        \"name\": \"name of image in XObject table\",\n        \"object\": \"reference to image stream\",\n        \"width\": \"image width\"\n      }\n    ],\n    \"label\": \"page label dictionary, or null if none\",\n    \"object\": \"reference to original page object\",\n    \"outlines\": [\n      {\n        \"dest\": \"outline destination dictionary\",\n        \"object\": \"reference to outline that targets this page\",\n        \"title\": \"outline title\"\n      }\n    ],\n    \"pageposfrom1\": \"position of page in document numbering from 1\"\n  }\n]"
               ,"");
    JSON::parse((JSON *)local_b0,&local_f8);
    JSON::addDictionaryMember((JSON *)local_d8,(string *)this,(JSON *)local_118);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    bVar3 = true;
    if (!bVar5) goto LAB_00180648;
LAB_001806a4:
    local_118._0_8_ = local_118 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"pagelabels","");
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,
               "[\n  {\n    \"index\": \"starting page position starting from zero\",\n    \"label\": \"page label dictionary\"\n  }\n]"
               ,"");
    JSON::parse((JSON *)local_b0,&local_f8);
    JSON::addDictionaryMember((JSON *)local_d8,(string *)this,(JSON *)local_118);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    bVar5 = true;
    if (!bVar3) goto LAB_00180759;
LAB_001807b0:
    local_118._0_8_ = local_118 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"outlines","");
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,
               "[\n  {\n    \"dest\": \"outline destination dictionary\",\n    \"destpageposfrom1\": \"position of destination page in document numbered from 1; null if not known\",\n    \"kids\": \"array of descendent outlines\",\n    \"object\": \"reference to this outline\",\n    \"open\": \"whether the outline is displayed expanded\",\n    \"title\": \"outline title\"\n  }\n]"
               ,"");
    JSON::parse((JSON *)local_b0,&local_f8);
    JSON::addDictionaryMember((JSON *)local_d8,local_b8,(JSON *)local_118);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    bVar3 = true;
    if (!bVar5) goto LAB_0018086c;
LAB_001808c7:
    bVar5 = bVar3;
    key = local_b8;
    local_118._0_8_ = local_118 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"acroform","");
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,
               "{\n  \"fields\": [\n    {\n      \"alternativename\": \"alternative name of field -- this is the one usually shown to users\",\n      \"annotation\": {\n        \"annotationflags\": \"annotation flags from /F -- see pdf_annotation_flag_e in qpdf/Constants.h\",\n        \"appearancestate\": \"appearance state -- can be used to determine value for checkboxes and radio buttons\",\n        \"object\": \"reference to the annotation object\"\n      },\n      \"choices\": \"for choices fields, the list of choices presented to the user\",\n      \"defaultvalue\": \"default value of field\",\n      \"fieldflags\": \"form field flags from /Ff -- see pdf_form_field_flag_e in qpdf/Constants.h\",\n      \"fieldtype\": \"field type\",\n      \"fullname\": \"full name of field\",\n      \"ischeckbox\": \"whether field is a checkbox\",\n      \"ischoice\": \"whether field is a list, combo, or dropdown\",\n      \"isradiobutton\": \"whether field is a radio button -- buttons in a single group share a parent\",\n      \"istext\": \"whether field is a text field\",\n      \"mappingname\": \"mapping name of field\",\n      \"object\": \"reference to this form field\",\n      \"pageposfrom1\": \"position of containing page numbered from 1\",\n      \"parent\": \"reference to this field\'s parent\",\n      \"partialname\": \"partial name of field\",\n      \"quadding\": \"field quadding -- number indicating left, center, or right\",\n      \"value\": \"value of field\"\n    }\n  ],\n  \"hasacroform\": \"whether the document has interactive forms\",\n  \"needappearances\": \"whether the form fields\' appearance streams need to be regenerated\"\n}"
               ,"");
    JSON::parse((JSON *)local_b0,&local_f8);
    JSON::addDictionaryMember((JSON *)local_d8,key,(JSON *)local_118);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
  }
  else {
    if (sVar2 == 0) {
      bVar3 = true;
LAB_00180475:
      local_118._0_8_ = local_118 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"qpdf","");
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,
                 "[{\n  \"jsonversion\": \"numeric JSON version\",\n  \"pdfversion\": \"PDF version as x.y\",\n  \"pushedinheritedpageresources\": \"whether inherited attributes were pushed to the page level\",\n  \"calledgetallpages\": \"whether getAllPages was called\",\n  \"maxobjectid\": \"highest object ID in output, ignored on input\"\n},\n{\n  \"<obj:n n R|trailer>\": \"json representation of object\"\n}]"
                 ,"");
      JSON::parse((JSON *)local_d8,&local_f8);
      JSON::addDictionaryMember(&local_60,(string *)this,(JSON *)local_118);
      if (local_60.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
      }
      bVar5 = true;
      bVar10 = 0;
      if (bVar3) goto LAB_00180593;
    }
    else {
      local_118._0_8_ = local_118 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"qpdf","");
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&keys->_M_t,(key_type *)local_118);
      if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
      }
      bVar10 = 0;
      bVar3 = false;
      this = (QPDFJob *)local_b8;
      if ((_Rb_tree_header *)cVar6._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header)
      goto LAB_00180475;
    }
LAB_00180538:
    local_118._0_8_ = local_118 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"pages","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&keys->_M_t,(key_type *)local_118);
    if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if ((_Rb_tree_header *)cVar6._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header) {
      bVar5 = false;
      this = (QPDFJob *)local_b8;
      goto LAB_00180593;
    }
LAB_00180648:
    local_118._0_8_ = local_118 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"pagelabels","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&keys->_M_t,(key_type *)local_118);
    if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if ((_Rb_tree_header *)cVar6._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header) {
      bVar3 = false;
      this = (QPDFJob *)local_b8;
      goto LAB_001806a4;
    }
LAB_00180759:
    local_118._0_8_ = local_118 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"outlines","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&keys->_M_t,(key_type *)local_118);
    if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    if ((_Rb_tree_header *)cVar6._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header) {
      bVar5 = false;
      goto LAB_001807b0;
    }
LAB_0018086c:
    local_118._0_8_ = local_118 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"acroform","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&keys->_M_t,(key_type *)local_118);
    if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    bVar5 = false;
    key = local_b8;
    bVar3 = false;
    if ((_Rb_tree_header *)cVar6._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header)
    goto LAB_001808c7;
  }
  pcVar11 = "modifyannotations";
  if (bVar10 != 0) {
    pcVar11 = "moddifyannotations";
  }
  local_118._0_8_ = local_118 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_118,pcVar11,pcVar11 + (ulong)bVar10 + 0x11);
  if (bVar5) {
LAB_001809f7:
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"encrypt","");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   "{\n  \"capabilities\": {\n    \"accessibility\": \"allow extraction for accessibility?\",\n    \"extract\": \"allow extraction?\",\n    \""
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
    plVar7 = (long *)std::__cxx11::string::append(local_b0);
    peVar8 = (element_type *)(plVar7 + 2);
    if ((element_type *)*plVar7 == peVar8) {
      local_d8._16_8_ =
           (peVar8->value)._M_t.
           super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t.
           super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
           super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl;
      local_d8._24_8_ = plVar7[3];
      local_d8._0_8_ = (element_type *)(local_d8 + 0x10);
    }
    else {
      local_d8._16_8_ =
           (peVar8->value)._M_t.
           super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t.
           super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
           super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl;
      local_d8._0_8_ = (element_type *)*plVar7;
    }
    local_d8._8_8_ = plVar7[1];
    *plVar7 = (long)peVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    JSON::parse(&local_80,(string *)local_d8);
    JSON::addDictionaryMember(&local_90,key,(JSON *)&local_f8);
    if (local_80.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((element_type *)local_d8._0_8_ != (element_type *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
    }
    if ((element_type *)local_b0._0_8_ != (element_type *)(local_b0 + 0x10)) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (!bVar5) goto LAB_00180b1c;
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"encrypt","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&keys->_M_t,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar6._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header)
    goto LAB_001809f7;
LAB_00180b1c:
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"attachments","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&keys->_M_t,&local_f8);
    _Var9._M_pi = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      _Var9._M_pi = extraout_RDX_00;
    }
    if ((_Rb_tree_header *)cVar6._M_node == &(keys->_M_t)._M_impl.super__Rb_tree_header)
    goto LAB_00180c22;
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"attachments","");
  local_d8._0_8_ = (element_type *)(local_d8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,
             "{\n  \"<attachment-key>\": {\n    \"filespec\": \"object containing the file spec\",\n    \"preferredcontents\": \"most preferred embedded file stream\",\n    \"preferredname\": \"most preferred file name\",\n    \"description\": \"description of attachment\",\n    \"names\": {\n      \"<name-key>\": \"file name for key\"\n    },\n    \"streams\": {\n      \"<stream-key>\": {\n        \"creationdate\": \"ISO-8601 creation date or null\",\n        \"modificationdate\": \"ISO-8601 modification date or null\",\n        \"mimetype\": \"mime type or null\",\n        \"checksum\": \"MD5 checksum or null\"\n      }\n    }\n  }\n}"
             ,"");
  JSON::parse(&local_90,(string *)local_d8);
  JVar12 = JSON::addDictionaryMember((JSON *)local_b0,key,(JSON *)&local_f8);
  _Var9._M_pi = JVar12.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  if (local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var9._M_pi = extraout_RDX_01;
  }
  if ((element_type *)local_d8._0_8_ != (element_type *)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
    _Var9._M_pi = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    _Var9._M_pi = extraout_RDX_03;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
    _Var9._M_pi = extraout_RDX_04;
  }
LAB_00180c22:
  if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    _Var9._M_pi = extraout_RDX_05;
  }
  if (local_70.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var9._M_pi = extraout_RDX_06;
  }
  JVar12.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  JVar12.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)key;
  return (JSON)JVar12.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
QPDFJob::json_schema(int json_version, std::set<std::string>* keys)
{
    // Style: use all lower-case keys with no dashes or underscores. Choose array or dictionary
    // based on indexing. For example, we use a dictionary for objects because we want to index by
    // object ID and an array for pages because we want to index by position. The pages in the pages
    // array contain references back to the original object, which can be resolved in the objects
    // dictionary. When a PDF construct that maps back to an original object is represented
    // separately, use "object" as the key that references the original object.

    // This JSON object doubles as a schema and as documentation for our JSON output. Any schema
    // mismatch is a bug in qpdf. This helps to enforce our policy of consistently providing a known
    // structure where every documented key will always be present, which makes it easier to consume
    // our JSON. This is discussed in more depth in the manual.
    JSON schema = JSON::makeDictionary();
    schema.addDictionaryMember(
        "version",
        JSON::makeString("JSON format serial number; increased for non-compatible changes"));
    JSON j_params = schema.addDictionaryMember("parameters", JSON::parse(R"({
  "decodelevel": "decode level used to determine stream filterability"
})"));

    bool all_keys = ((keys == nullptr) || keys->empty());

    // The list of selectable top-level keys id duplicated in the following places: job.yml,
    // QPDFJob::json_schema, and QPDFJob::doJSON.
    if (json_version == 1) {
        if (all_keys || keys->count("objects")) {
            schema.addDictionaryMember("objects", JSON::parse(R"({
  "<n n R|trailer>": "json representation of object"
})"));
        }
        if (all_keys || keys->count("objectinfo")) {
            JSON objectinfo = schema.addDictionaryMember("objectinfo", JSON::parse(R"({
  "<object-id>": {
    "stream": {
      "filter": "if stream, its filters, otherwise null",
      "is": "whether the object is a stream",
      "length": "if stream, its length, otherwise null"
    }
  }
})"));
        }
    } else {
        if (all_keys || keys->count("qpdf")) {
            schema.addDictionaryMember("qpdf", JSON::parse(R"([{
  "jsonversion": "numeric JSON version",
  "pdfversion": "PDF version as x.y",
  "pushedinheritedpageresources": "whether inherited attributes were pushed to the page level",
  "calledgetallpages": "whether getAllPages was called",
  "maxobjectid": "highest object ID in output, ignored on input"
},
{
  "<obj:n n R|trailer>": "json representation of object"
}])"));
        }
    }
    if (all_keys || keys->count("pages")) {
        JSON page = schema.addDictionaryMember("pages", JSON::parse(R"([
  {
    "contents": [
      "reference to each content stream"
    ],
    "images": [
      {
        "bitspercomponent": "bits per component",
        "colorspace": "color space",
        "decodeparms": [
          "decode parameters for image data"
        ],
        "filter": [
          "filters applied to image data"
        ],
        "filterable": "whether image data can be decoded using the decode level qpdf was invoked with",
        "height": "image height",
        "name": "name of image in XObject table",
        "object": "reference to image stream",
        "width": "image width"
      }
    ],
    "label": "page label dictionary, or null if none",
    "object": "reference to original page object",
    "outlines": [
      {
        "dest": "outline destination dictionary",
        "object": "reference to outline that targets this page",
        "title": "outline title"
      }
    ],
    "pageposfrom1": "position of page in document numbering from 1"
  }
])"));
    }
    if (all_keys || keys->count("pagelabels")) {
        JSON labels = schema.addDictionaryMember("pagelabels", JSON::parse(R"([
  {
    "index": "starting page position starting from zero",
    "label": "page label dictionary"
  }
])"));
    }
    if (all_keys || keys->count("outlines")) {
        JSON outlines = schema.addDictionaryMember("outlines", JSON::parse(R"([
  {
    "dest": "outline destination dictionary",
    "destpageposfrom1": "position of destination page in document numbered from 1; null if not known",
    "kids": "array of descendent outlines",
    "object": "reference to this outline",
    "open": "whether the outline is displayed expanded",
    "title": "outline title"
  }
])"));
    }
    if (all_keys || keys->count("acroform")) {
        JSON acroform = schema.addDictionaryMember("acroform", JSON::parse(R"({
  "fields": [
    {
      "alternativename": "alternative name of field -- this is the one usually shown to users",
      "annotation": {
        "annotationflags": "annotation flags from /F -- see pdf_annotation_flag_e in qpdf/Constants.h",
        "appearancestate": "appearance state -- can be used to determine value for checkboxes and radio buttons",
        "object": "reference to the annotation object"
      },
      "choices": "for choices fields, the list of choices presented to the user",
      "defaultvalue": "default value of field",
      "fieldflags": "form field flags from /Ff -- see pdf_form_field_flag_e in qpdf/Constants.h",
      "fieldtype": "field type",
      "fullname": "full name of field",
      "ischeckbox": "whether field is a checkbox",
      "ischoice": "whether field is a list, combo, or dropdown",
      "isradiobutton": "whether field is a radio button -- buttons in a single group share a parent",
      "istext": "whether field is a text field",
      "mappingname": "mapping name of field",
      "object": "reference to this form field",
      "pageposfrom1": "position of containing page numbered from 1",
      "parent": "reference to this field's parent",
      "partialname": "partial name of field",
      "quadding": "field quadding -- number indicating left, center, or right",
      "value": "value of field"
    }
  ],
  "hasacroform": "whether the document has interactive forms",
  "needappearances": "whether the form fields' appearance streams need to be regenerated"
})"));
    }
    std::string MODIFY_ANNOTATIONS =
        (json_version == 1 ? "moddifyannotations" : "modifyannotations");
    if (all_keys || keys->count("encrypt")) {
        JSON encrypt = schema.addDictionaryMember("encrypt", JSON::parse(R"({
  "capabilities": {
    "accessibility": "allow extraction for accessibility?",
    "extract": "allow extraction?",
    ")" + MODIFY_ANNOTATIONS + R"(": "allow modifying annotations?",
    "modify": "allow all modifications?",
    "modifyassembly": "allow modifying document assembly?",
    "modifyforms": "allow modifying forms?",
    "modifyother": "allow other modifications?",
    "printhigh": "allow high resolution printing?",
    "printlow": "allow low resolution printing?"
  },
  "encrypted": "whether the document is encrypted",
  "ownerpasswordmatched": "whether supplied password matched owner password; always false for non-encrypted files",
  "recovereduserpassword": "If the owner password was used to recover the user password, reveal user password; otherwise null",
  "parameters": {
    "P": "P value from Encrypt dictionary",
    "R": "R value from Encrypt dictionary",
    "V": "V value from Encrypt dictionary",
    "bits": "encryption key bit length",
    "filemethod": "encryption method for attachments",
    "key": "encryption key; will be null unless --show-encryption-key was specified",
    "method": "overall encryption method: none, mixed, RC4, AESv2, AESv3",
    "streammethod": "encryption method for streams",
    "stringmethod": "encryption method for string"
  },
  "userpasswordmatched": "whether supplied password matched user password; always false for non-encrypted files"
})"));
    }
    if (all_keys || keys->count("attachments")) {
        JSON attachments = schema.addDictionaryMember("attachments", JSON::parse(R"({
  "<attachment-key>": {
    "filespec": "object containing the file spec",
    "preferredcontents": "most preferred embedded file stream",
    "preferredname": "most preferred file name",
    "description": "description of attachment",
    "names": {
      "<name-key>": "file name for key"
    },
    "streams": {
      "<stream-key>": {
        "creationdate": "ISO-8601 creation date or null",
        "modificationdate": "ISO-8601 modification date or null",
        "mimetype": "mime type or null",
        "checksum": "MD5 checksum or null"
      }
    }
  }
})"));
    }
    return schema;
}